

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_GlaDumpAbsracted(Ga2_Man_t *p,int fVerbose)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  Gia_Man_t *pGVar3;
  Ga2_Man_t *pGVar4;
  Vec_Int_t *vGateClasses;
  
  if (p->pPars->fDumpMabs != 0) {
    pGVar4 = p;
    pcVar1 = Ga2_GlaGetFileName(p,0);
    if (fVerbose != 0) {
      Abc_Print((int)pGVar4,"Dumping miter with abstraction map into file \"%s\"...\n",pcVar1);
    }
    Vec_IntFreeP(&p->pGia->vGateClasses);
    pVVar2 = Ga2_ManAbsTranslate(p);
    pGVar3 = p->pGia;
    pGVar3->vGateClasses = pVVar2;
    Gia_AigerWrite(pGVar3,pcVar1,0,0,0);
    return;
  }
  if (p->pPars->fDumpVabs != 0) {
    pGVar4 = p;
    pcVar1 = Ga2_GlaGetFileName(p,1);
    if (fVerbose != 0) {
      Abc_Print((int)pGVar4,"Dumping abstracted model into file \"%s\"...\n",pcVar1);
    }
    vGateClasses = Ga2_ManAbsTranslate(p);
    pGVar3 = Gia_ManDupAbsGates(p->pGia,vGateClasses);
    Gia_ManCleanValue(p->pGia);
    Gia_AigerWrite(pGVar3,pcVar1,0,0,0);
    Gia_ManStop(pGVar3);
    Vec_IntFreeP(&vGateClasses);
    return;
  }
  __assert_fail("p->pPars->fDumpMabs || p->pPars->fDumpVabs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                ,0x590,"void Ga2_GlaDumpAbsracted(Ga2_Man_t *, int)");
}

Assistant:

void Ga2_GlaDumpAbsracted( Ga2_Man_t * p, int fVerbose )
{
    char * pFileName;
    assert( p->pPars->fDumpMabs || p->pPars->fDumpVabs );
    if ( p->pPars->fDumpMabs )
    {
        pFileName = Ga2_GlaGetFileName(p, 0);
        if ( fVerbose )
            Abc_Print( 1, "Dumping miter with abstraction map into file \"%s\"...\n", pFileName );
        // dump abstraction map
        Vec_IntFreeP( &p->pGia->vGateClasses );
        p->pGia->vGateClasses = Ga2_ManAbsTranslate( p );
        Gia_AigerWrite( p->pGia, pFileName, 0, 0, 0 );
    }
    else if ( p->pPars->fDumpVabs )
    {
        Vec_Int_t * vGateClasses;
        Gia_Man_t * pAbs;
        pFileName = Ga2_GlaGetFileName(p, 1);
        if ( fVerbose )
            Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
        // dump absracted model
        vGateClasses = Ga2_ManAbsTranslate( p );
        pAbs = Gia_ManDupAbsGates( p->pGia, vGateClasses );
        Gia_ManCleanValue( p->pGia );
        Gia_AigerWrite( pAbs, pFileName, 0, 0, 0 );
        Gia_ManStop( pAbs );
        Vec_IntFreeP( &vGateClasses );
    }
    else assert( 0 );
}